

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O0

CURLcode Curl_ssl_push_certinfo_len
                   (Curl_easy *data,int certnum,char *label,char *value,size_t valuelen)

{
  size_t sVar1;
  size_t maxlength;
  char *buffer;
  curl_slist *pcVar2;
  size_t outlen;
  size_t labellen;
  CURLcode result;
  curl_slist *nl;
  char *output;
  curl_certinfo *ci;
  size_t valuelen_local;
  char *value_local;
  char *label_local;
  int certnum_local;
  Curl_easy *data_local;
  
  labellen._4_4_ = CURLE_OK;
  sVar1 = strlen(label);
  maxlength = sVar1 + valuelen + 2;
  buffer = (char *)(*Curl_cmalloc)(maxlength);
  if (buffer == (char *)0x0) {
    data_local._4_4_ = CURLE_OUT_OF_MEMORY;
  }
  else {
    curl_msnprintf(buffer,maxlength,"%s:",label);
    memcpy(buffer + sVar1 + 1,value,valuelen);
    buffer[sVar1 + 1 + valuelen] = '\0';
    pcVar2 = Curl_slist_append_nodup((data->info).certs.certinfo[certnum],buffer);
    if (pcVar2 == (curl_slist *)0x0) {
      (*Curl_cfree)(buffer);
      curl_slist_free_all((data->info).certs.certinfo[certnum]);
      labellen._4_4_ = CURLE_OUT_OF_MEMORY;
    }
    (data->info).certs.certinfo[certnum] = pcVar2;
    data_local._4_4_ = labellen._4_4_;
  }
  return data_local._4_4_;
}

Assistant:

CURLcode Curl_ssl_push_certinfo_len(struct Curl_easy *data,
                                    int certnum,
                                    const char *label,
                                    const char *value,
                                    size_t valuelen)
{
  struct curl_certinfo *ci = &data->info.certs;
  char *output;
  struct curl_slist *nl;
  CURLcode result = CURLE_OK;
  size_t labellen = strlen(label);
  size_t outlen = labellen + 1 + valuelen + 1; /* label:value\0 */

  output = malloc(outlen);
  if(!output)
    return CURLE_OUT_OF_MEMORY;

  /* sprintf the label and colon */
  msnprintf(output, outlen, "%s:", label);

  /* memcpy the value (it might not be null-terminated) */
  memcpy(&output[labellen + 1], value, valuelen);

  /* null-terminate the output */
  output[labellen + 1 + valuelen] = 0;

  nl = Curl_slist_append_nodup(ci->certinfo[certnum], output);
  if(!nl) {
    free(output);
    curl_slist_free_all(ci->certinfo[certnum]);
    result = CURLE_OUT_OF_MEMORY;
  }

  ci->certinfo[certnum] = nl;
  return result;
}